

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O2

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessMesh(MakeLeftHandedProcess *this,aiMesh *pMesh)

{
  aiVector3D *paVar1;
  aiBone *paVar2;
  bool bVar3;
  size_t m;
  Logger *this_00;
  ulong uVar4;
  aiAnimMesh *paVar5;
  long lVar6;
  size_t a;
  ulong uVar7;
  
  if (pMesh != (aiMesh *)0x0) {
    lVar6 = 8;
    for (uVar7 = 0; uVar7 < pMesh->mNumVertices; uVar7 = uVar7 + 1) {
      *(uint *)((long)&pMesh->mVertices->x + lVar6) =
           *(uint *)((long)&pMesh->mVertices->x + lVar6) ^ 0x80000000;
      paVar1 = pMesh->mNormals;
      if ((paVar1 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
        *(uint *)((long)&paVar1->x + lVar6) = *(uint *)((long)&paVar1->x + lVar6) ^ 0x80000000;
      }
      bVar3 = aiMesh::HasTangentsAndBitangents(pMesh);
      if (bVar3) {
        *(uint *)((long)&pMesh->mTangents->x + lVar6) =
             *(uint *)((long)&pMesh->mTangents->x + lVar6) ^ 0x80000000;
        *(uint *)((long)&pMesh->mBitangents->x + lVar6) =
             *(uint *)((long)&pMesh->mBitangents->x + lVar6) ^ 0x80000000;
      }
      lVar6 = lVar6 + 0xc;
    }
    for (uVar7 = 0; uVar7 < pMesh->mNumAnimMeshes; uVar7 = uVar7 + 1) {
      lVar6 = 8;
      for (uVar4 = 0; uVar4 < pMesh->mAnimMeshes[uVar7]->mNumVertices; uVar4 = uVar4 + 1) {
        paVar1 = pMesh->mAnimMeshes[uVar7]->mVertices;
        *(uint *)((long)&paVar1->x + lVar6) = *(uint *)((long)&paVar1->x + lVar6) ^ 0x80000000;
        paVar5 = pMesh->mAnimMeshes[uVar7];
        paVar1 = paVar5->mNormals;
        if (paVar1 != (aiVector3D *)0x0) {
          *(uint *)((long)&paVar1->x + lVar6) = *(uint *)((long)&paVar1->x + lVar6) ^ 0x80000000;
          paVar5 = pMesh->mAnimMeshes[uVar7];
        }
        paVar1 = paVar5->mTangents;
        if (paVar1 != (aiVector3D *)0x0) {
          *(uint *)((long)&paVar1->x + lVar6) = *(uint *)((long)&paVar1->x + lVar6) ^ 0x80000000;
          paVar1 = pMesh->mAnimMeshes[uVar7]->mBitangents;
          *(uint *)((long)&paVar1->x + lVar6) = *(uint *)((long)&paVar1->x + lVar6) ^ 0x80000000;
        }
        lVar6 = lVar6 + 0xc;
      }
    }
    for (uVar7 = 0; uVar7 < pMesh->mNumBones; uVar7 = uVar7 + 1) {
      paVar2 = pMesh->mBones[uVar7];
      (paVar2->mOffsetMatrix).a3 = -(paVar2->mOffsetMatrix).a3;
      (paVar2->mOffsetMatrix).b3 = -(paVar2->mOffsetMatrix).b3;
      (paVar2->mOffsetMatrix).d3 = -(paVar2->mOffsetMatrix).d3;
      uVar4._0_4_ = (paVar2->mOffsetMatrix).c1;
      uVar4._4_4_ = (paVar2->mOffsetMatrix).c2;
      (paVar2->mOffsetMatrix).c1 = (float)(int)(uVar4 ^ 0x8000000080000000);
      (paVar2->mOffsetMatrix).c2 = (float)(int)((uVar4 ^ 0x8000000080000000) >> 0x20);
      (paVar2->mOffsetMatrix).c4 = -(paVar2->mOffsetMatrix).c4;
    }
    bVar3 = aiMesh::HasTangentsAndBitangents(pMesh);
    if (bVar3) {
      lVar6 = 0;
      for (uVar7 = 0; uVar7 < pMesh->mNumVertices; uVar7 = uVar7 + 1) {
        aiVector3t<float>::operator*=
                  ((aiVector3t<float> *)((long)&pMesh->mBitangents->x + lVar6),-1.0);
        lVar6 = lVar6 + 0xc;
      }
    }
    return;
  }
  this_00 = DefaultLogger::get();
  Logger::error(this_00,"Nullptr to mesh found.");
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessMesh( aiMesh* pMesh) {
    if ( nullptr == pMesh ) {
        ASSIMP_LOG_ERROR( "Nullptr to mesh found." );
        return;
    }
    // mirror positions, normals and stuff along the Z axis
    for( size_t a = 0; a < pMesh->mNumVertices; ++a)
    {
        pMesh->mVertices[a].z *= -1.0f;
        if (pMesh->HasNormals()) {
            pMesh->mNormals[a].z *= -1.0f;
        }
        if( pMesh->HasTangentsAndBitangents())
        {
            pMesh->mTangents[a].z *= -1.0f;
            pMesh->mBitangents[a].z *= -1.0f;
        }
    }

    // mirror anim meshes positions, normals and stuff along the Z axis
    for (size_t m = 0; m < pMesh->mNumAnimMeshes; ++m)
    {
        for (size_t a = 0; a < pMesh->mAnimMeshes[m]->mNumVertices; ++a)
        {
            pMesh->mAnimMeshes[m]->mVertices[a].z *= -1.0f;
            if (pMesh->mAnimMeshes[m]->HasNormals()) {
                pMesh->mAnimMeshes[m]->mNormals[a].z *= -1.0f;
            }
            if (pMesh->mAnimMeshes[m]->HasTangentsAndBitangents())
            {
                pMesh->mAnimMeshes[m]->mTangents[a].z *= -1.0f;
                pMesh->mAnimMeshes[m]->mBitangents[a].z *= -1.0f;
            }
        }
    }

    // mirror offset matrices of all bones
    for( size_t a = 0; a < pMesh->mNumBones; ++a)
    {
        aiBone* bone = pMesh->mBones[a];
        bone->mOffsetMatrix.a3 = -bone->mOffsetMatrix.a3;
        bone->mOffsetMatrix.b3 = -bone->mOffsetMatrix.b3;
        bone->mOffsetMatrix.d3 = -bone->mOffsetMatrix.d3;
        bone->mOffsetMatrix.c1 = -bone->mOffsetMatrix.c1;
        bone->mOffsetMatrix.c2 = -bone->mOffsetMatrix.c2;
        bone->mOffsetMatrix.c4 = -bone->mOffsetMatrix.c4;
    }

    // mirror bitangents as well as they're derived from the texture coords
    if( pMesh->HasTangentsAndBitangents())
    {
        for( unsigned int a = 0; a < pMesh->mNumVertices; a++)
            pMesh->mBitangents[a] *= -1.0f;
    }
}